

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigParser.cpp
# Opt level: O3

void __thiscall
ConfigParser::ParseConfig
          (ConfigParser *this,HANDLE hmod,CmdLineArgsParser *parser,char16 *strCustomConfigFile)

{
  WCHAR WVar1;
  uint uVar2;
  ConfigFlagsTable *pCVar3;
  code *pcVar4;
  WCHAR *pWVar5;
  bool bVar6;
  int c;
  int iVar7;
  int iVar8;
  DWORD DVar9;
  undefined4 *puVar10;
  WCHAR *pWVar11;
  PAL_FILE *f;
  long lVar12;
  WCHAR *pWVar13;
  size_t _Count;
  char16_t *_Ext;
  LPWSTR lpFileName;
  char16 *_Filename;
  WCHAR local_c68 [4];
  char16 filename [260];
  char16_t local_a58 [4];
  WCHAR configFileFullName [260];
  WCHAR local_848 [4];
  char16 configBuffer [512];
  char16 dir [256];
  char16 modulename [260];
  WCHAR local_36;
  undefined4 local_34;
  char16 drive [3];
  
  if ((strCustomConfigFile == (char16 *)0x0) && (this->_hasReadConfig != false)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ConfigParser.cpp"
                       ,0x17a,"(!_hasReadConfig || strCustomConfigFile != nullptr)",
                       "!_hasReadConfig || strCustomConfigFile != nullptr");
    if (!bVar6) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar10 = 0;
  }
  this->_hasReadConfig = true;
  _Filename = strCustomConfigFile;
  if (strCustomConfigFile == (char16 *)0x0) {
    _Filename = this->_configFileName;
  }
  _Ext = L"";
  if (strCustomConfigFile == (char16 *)0x0) {
    _Ext = L".config";
  }
  lpFileName = dir + 0xfc;
  GetModuleFileNameW(hmod,lpFileName,0x104);
  if (dir[0xfc] == L'\\') {
    if ((dir[0xfd] == L'\\') && (dir[0xfe] == L'?')) {
      lpFileName = modulename + (ulong)(dir[0xff] == L'\\') * 4 + -4;
      dir[0xfc] = *lpFileName;
      goto LAB_00360d0c;
    }
LAB_00360d16:
    if (dir[0xfd] == L':') {
      wcsncpy_s(&local_36,3,lpFileName,2);
      lpFileName = lpFileName + 2;
      goto LAB_00360d45;
    }
  }
  else {
LAB_00360d0c:
    if (dir[0xfc] != L'\0') {
      dir[0xfd] = lpFileName[1];
      goto LAB_00360d16;
    }
  }
  local_36 = L'\0';
  local_34 = 0xfdfdfdfd;
LAB_00360d45:
  pWVar11 = (WCHAR *)0x0;
  pWVar5 = lpFileName;
  do {
    do {
      pWVar13 = pWVar11;
      pWVar11 = pWVar5 + 1;
      WVar1 = *pWVar5;
      pWVar5 = pWVar11;
    } while (WVar1 == L'/');
  } while ((WVar1 == L'\\') || (pWVar11 = pWVar13, WVar1 != L'\0'));
  if (pWVar13 == (WCHAR *)0x0) {
    configBuffer[0x1fc] = L'\0';
    memset(configBuffer + 0x1fd,0xfd,0x1fe);
  }
  else {
    _Count = (long)pWVar13 - (long)lpFileName >> 1;
    if (_Count < 0x100) {
      wcsncpy_s(configBuffer + 0x1fc,0x100,lpFileName,_Count);
    }
    else {
      local_36 = L'\0';
      local_34 = 0xfdfdfdfd;
      configBuffer[0x1fc] = L'\0';
      memset(configBuffer + 0x1fd,0xfd,0x1fe);
      RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
    }
  }
  _wmakepath_s(local_c68,0x104,&local_36,configBuffer + 0x1fc,_Filename,_Ext);
  f = _wfopen(local_c68,L"r");
  if (f == (PAL_FILE *)0x0) {
    DVar9 = GetEnvironmentVariableW(L"HOME",local_848,0x104);
    if (DVar9 == 0) {
      return;
    }
    StringCchPrintfW(local_a58,0x104,L"%s/%s%s",local_848,_Filename,_Ext);
    f = _wfopen(local_a58,L"r");
    if (f == (PAL_FILE *)0x0) {
      return;
    }
  }
  iVar8 = 0;
  do {
    c = PAL_getc(f);
    pCVar3 = this->_flags;
    uVar2 = pCVar3->rawInputFromConfigFileIndex;
    if ((ulong)uVar2 < 0x200) {
      pCVar3->rawInputFromConfigFileIndex = uVar2 + 1;
      pCVar3->rawInputFromConfigFile[uVar2] = (WCHAR)c;
    }
    if (c == -1) {
      local_848[iVar8] = L'\0';
      if (0 < iVar8) {
LAB_00360ea1:
        iVar8 = CmdLineArgsParser::Parse(parser,local_848);
        if (iVar8 == 0) goto joined_r0x00360eb5;
      }
      break;
    }
    iVar7 = isspace(c);
    if (c == 0 || iVar7 != 0) {
      local_848[iVar8] = L'\0';
      if (0 < iVar8) goto LAB_00360ea1;
      while ((iVar8 = isspace(c), c == 0 || (iVar8 != 0))) {
        c = PAL_getc(f);
joined_r0x00360eb5:
        if (c == -1) goto LAB_00360f03;
      }
      PAL_ungetc(c,f);
      iVar8 = 0;
    }
    else {
      lVar12 = (long)iVar8;
      iVar8 = iVar8 + 1;
      local_848[lVar12] = (WCHAR)c;
    }
  } while (iVar8 < 0x200);
LAB_00360f03:
  PAL_fclose(f);
  return;
}

Assistant:

void ConfigParser::ParseConfig(HANDLE hmod, CmdLineArgsParser &parser, const char16* strCustomConfigFile)
{
#if defined(ENABLE_DEBUG_CONFIG_OPTIONS) && CONFIG_PARSE_CONFIG_FILE
    Assert(!_hasReadConfig || strCustomConfigFile != nullptr);
    _hasReadConfig = true;

    const char16* configFileName = strCustomConfigFile;
    const char16* configFileExt = _u(""); /* in the custom config case,
                                             ext is expected to be passed
                                             in as part of the filename */

    if (configFileName == nullptr)
    {
        configFileName = _configFileName;
        configFileExt = _u(".config");
    }

    int err = 0;
    char16 modulename[_MAX_PATH];
    char16 filename[_MAX_PATH];

    GetModuleFileName((HMODULE)hmod, modulename, _MAX_PATH);
    char16 drive[_MAX_DRIVE];
    char16 dir[_MAX_DIR];

    _wsplitpath_s(modulename, drive, _MAX_DRIVE, dir, _MAX_DIR, nullptr, 0, nullptr, 0);
    _wmakepath_s(filename, drive, dir, configFileName, configFileExt);

    FILE* configFile;
#ifdef _WIN32
    if (_wfopen_s(&configFile, filename, _u("r, ccs=UNICODE")) != 0 || configFile == nullptr)
    {
        WCHAR configFileFullName[MAX_PATH];

        StringCchPrintf(configFileFullName, MAX_PATH, _u("%s%s"), configFileName, configFileExt);

        // try the one in the current working directory (Desktop)
        if (_wfullpath(filename, configFileFullName, _MAX_PATH) == nullptr)
        {
            return;
        }

        if (_wfopen_s(&configFile, filename, _u("r, ccs=UNICODE")) != 0 || configFile == nullptr)
        {
            return;
        }
    }
#else
    // Two-pathed for a couple reasons
    // 1. PAL doesn't like the ccs option passed in.
    // 2. _wfullpath is not implemented in the PAL.
    // Instead, on xplat, we'll check the HOME directory to see if there is
    // a config file there that we can use
    if (_wfopen_s(&configFile, filename, _u("r")) != 0 || configFile == nullptr)
    {
        WCHAR homeDir[MAX_PATH];

        if (GetEnvironmentVariable(_u("HOME"), homeDir, MAX_PATH) == 0)
        {
            return;
        }
        
        WCHAR configFileFullName[MAX_PATH];

        StringCchPrintf(configFileFullName, MAX_PATH, _u("%s/%s%s"), homeDir, configFileName, configFileExt);
        if (_wfopen_s(&configFile, configFileFullName, _u("r")) != 0 || configFile == nullptr)
        {
            return;
        }
    }
#endif

    char16 configBuffer[MaxTokenSize];
    int index = 0;

#ifdef _WIN32
#define ReadChar(file) fgetwc(file)
#define UnreadChar(c, file) ungetwc(c, file)
#define CharType wint_t
#define EndChar WEOF
#else
#define ReadChar(file) fgetc(file)
#define UnreadChar(c, file) ungetc(c, file)
#define CharType int
#define EndChar EOF
#endif

    // We don't expect the token to overflow- if it does
    // the simplest thing to do would be to ignore the
    // read tokens
    // We could use _fwscanf_s here but the function
    // isn't implemented in the PAL and we'd have to deal with
    // wchar => char16 impedance mismatch.
    while (index < MaxTokenSize)
    {
        CharType curChar = ReadChar(configFile);

        if (this->_flags.rawInputFromConfigFileIndex < sizeof(this->_flags.rawInputFromConfigFile) / sizeof(this->_flags.rawInputFromConfigFile[0]))
        {
            this->_flags.rawInputFromConfigFile[this->_flags.rawInputFromConfigFileIndex++] = curChar;
        }

        if (curChar == EndChar || isspace(curChar) || curChar == 0)
        {
            configBuffer[index] = 0;

            // Parse only if there's something in configBuffer
            if (index > 0 && (err = parser.Parse(configBuffer)) != 0)
            {
                break;
            }

            while(curChar != EndChar && (isspace(curChar) || curChar == 0))
            {
                curChar = ReadChar(configFile);
            }

            if (curChar == EndChar)
            {
                break;
            }
            else
            {
                UnreadChar(curChar, configFile);
            }

            index = 0;
        }
        else
        {
            // The expectation is that non-ANSI characters
            // are not used in the config- otherwise it will
            // be interpreted incorrectly here
            configBuffer[index++] = (char16) curChar;
        }
    }

#undef ReadChar
#undef UnreadChar
#undef CharType
#undef EndChar

    fclose(configFile);

    if (err !=0)
    {
        return;
    }
#endif
}